

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,CallInst *call,bool decl)

{
  TypeID TVar1;
  uint uVar2;
  Type *in_RAX;
  Type *this_00;
  Function *this_01;
  String *ts_2;
  Value *value;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
  _Var3;
  const_iterator cVar4;
  undefined7 in_register_00000011;
  uint index;
  Type *local_38;
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_38 = (Type *)Value::get_tween_id((Value *)call);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1a7902,(unsigned_long *)&local_38);
  }
  else {
    local_38 = in_RAX;
    this_00 = Value::getType((Value *)call);
    TVar1 = Type::getTypeID(this_00);
    if (TVar1 != VoidTyID) {
      local_38 = (Type *)Value::get_tween_id((Value *)call);
      append<char_const(&)[2],unsigned_long,char_const(&)[4]>
                (this,(char (*) [2])0x1a7902,(unsigned_long *)&local_38,(char (*) [4])" = ");
    }
    local_38 = Value::getType((Value *)call);
    this_01 = CallInst::getCalledFunction(call);
    ts_2 = Function::getName_abi_cxx11_(this_01);
    append<char_const(&)[6],LLVMBC::Type*,char_const(&)[3],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[2]>
              (this,(char (*) [6])"call ",&local_38,(char (*) [3])" @",ts_2,(char (*) [2])0x1a77ab);
    index = 0;
    while( true ) {
      uVar2 = Instruction::getNumOperands(&call->super_Instruction);
      if (uVar2 <= index) break;
      value = Instruction::getOperand(&call->super_Instruction,index);
      append(this,value,false);
      index = index + 1;
      uVar2 = Instruction::getNumOperands(&call->super_Instruction);
      if (index < uVar2) {
        std::operator<<((ostream *)this,", ");
      }
    }
    std::operator<<((ostream *)this,")");
    _Var3._M_cur = (__node_type *)Instruction::metadata_begin_abi_cxx11_(&call->super_Instruction);
    while( true ) {
      cVar4 = Instruction::metadata_end_abi_cxx11_(&call->super_Instruction);
      if ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
           )_Var3._M_cur ==
          cVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
          ._M_cur) break;
      append<char_const(&)[3],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[2],LLVMBC::MDNode*const&>
                (this,(char (*) [3])" !",
                 (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)&(_Var3._M_cur)->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
                 ,(char (*) [2])0x1a77b6,
                 (MDNode **)
                 ((long)&((_Var3._M_cur)->
                         super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>_>
                         ._M_storage._M_storage + 0x20));
      _Var3._M_cur = (__node_type *)((_Var3._M_cur)->super__Hash_node_base)._M_nxt;
    }
  }
  return;
}

Assistant:

void StreamState::append(CallInst *call, bool decl)
{
	if (decl)
	{
		if (call->getType()->getTypeID() != Type::TypeID::VoidTyID)
			append("%", call->get_tween_id(), " = ");
		append("call ", call->getType(), " @", call->getCalledFunction()->getName(), "(");
		for (unsigned i = 0; i < call->getNumOperands(); i++)
		{
			append(call->getOperand(i));
			if (i + 1 < call->getNumOperands())
				append(", ");
		}
		append(")");

		for (auto itr = call->metadata_begin(); itr != call->metadata_end(); ++itr)
		{
			append(" !", itr->first, " ", itr->second);
		}
	}
	else
	{
		append("%", call->get_tween_id());
	}
}